

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpserver.cpp
# Opt level: O1

void __thiscall uv::TCPServer::closeinl(TCPServer *this)

{
  long lVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  ILog4zManager *pIVar4;
  char *__s;
  long *in_FS_OFFSET;
  
  if (this->isclosed_ != false) {
    return;
  }
  uv_mutex_lock(&this->mutex_clients_);
  for (p_Var3 = (this->clients_list_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->clients_list_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    AcceptClient::Close((AcceptClient *)p_Var3[1]._M_parent);
  }
  uv_mutex_unlock(&this->mutex_clients_);
  uv_walk(&this->loop_,CloseWalkCB,this);
  lVar1 = *in_FS_OFFSET;
  *(undefined8 *)(lVar1 + -0x7fb) = 0x72657672657320;
  *(undefined8 *)(lVar1 + -0x800) = 0x65732065736f6c63;
  *(undefined4 *)(lVar1 + -0x7f4) = 0x202820;
  *(undefined2 *)(lVar1 + -0x7f1) = 0x20;
  *(undefined2 *)(lVar1 + -0x7ec) = 0x20;
  *(undefined4 *)(lVar1 + -0x7f0) = 0x3a202920;
  __s = (char *)(lVar1 + -0x7eb);
  iVar2 = snprintf(__s,0x7eb,"%d",0x5c);
  if (-1 < iVar2) {
    if (iVar2 < 0x7eb) goto LAB_001180c1;
    __s = (char *)(lVar1 + -1);
  }
  *__s = '\0';
LAB_001180c1:
  pIVar4 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar4->_vptr_ILog4zManager[8])
            (pIVar4,0,1,(undefined8 *)(lVar1 + -0x800),pIVar4->_vptr_ILog4zManager[8]);
  return;
}

Assistant:

void TCPServer::closeinl()
{
    if (isclosed_) {
        return;
    }

    uv_mutex_lock(&mutex_clients_);
    for (auto it = clients_list_.begin(); it != clients_list_.end(); ++it) {
        auto data = it->second;
        data->Close();
    }
    uv_mutex_unlock(&mutex_clients_);
    uv_walk(&loop_, CloseWalkCB, this);//close all handle in loop
    LOGI("close server");
}